

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O1

OCSPRevocationStatus __thiscall
bssl::anon_unknown_20::GetRevocationStatusForCert
          (anon_unknown_20 *this,OCSPResponseData *response_data,ParsedCertificate *cert,
          ParsedCertificate *issuer_certificate,int64_t verify_time_epoch_seconds,
          optional<long> max_age_seconds,ResponseStatus *response_details)

{
  Input *pIVar1;
  _Rb_tree_node_base *p_Var2;
  uint uVar3;
  OCSPRevocationStatus OVar4;
  Input lhs;
  Input value;
  Input hash;
  Input hash_00;
  Input lhs_00;
  Input raw_tlv;
  Input extensions_tlv;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  EVP_MD *type;
  uint *out;
  int iVar7;
  undefined8 *puVar8;
  GeneralizedTime *this_update;
  ResponseStatus *pRVar9;
  undefined8 *puVar10;
  Input rhs;
  Input raw_tlv_00;
  Input spki_tlv;
  optional<long> max_age_seconds_00;
  OCSPCertID cert_id;
  OCSPSingleResponse single_response;
  OCSPRevocationStatus local_f0;
  ParsedCertificate *local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  OCSPResponseData *local_d8;
  undefined1 local_d0 [12];
  undefined4 uStack_c4;
  _Base_ptr p_Stack_c0;
  _Rb_tree_node_base *local_b8;
  _Rb_tree_node_base *p_Stack_b0;
  uchar *local_a8;
  size_t sStack_a0;
  ParsedCertificate *local_98;
  int64_t local_90;
  ParsedCertificate *local_88;
  undefined8 *local_80;
  uchar *local_78;
  size_t sStack_70;
  OCSPRevocationStatus local_68;
  bssl local_54 [8];
  char local_4c;
  GeneralizedTime local_4a;
  char local_42;
  uchar *local_40;
  size_t sStack_38;
  
  *(undefined4 *)
   max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
   super__Optional_payload_base<long>._M_payload = 5;
  puVar10 = *(undefined8 **)(this + 0x38);
  puVar8 = *(undefined8 **)(this + 0x40);
  if (puVar10 == puVar8) {
LAB_004b0f6c:
    local_f0 = MAX_VALUE;
  }
  else {
    p_Var2 = (_Rb_tree_node_base *)(local_d0 + 8);
    local_f0 = MAX_VALUE;
    out = (uint *)issuer_certificate;
    pRVar9 = response_details;
    local_d8 = response_data;
    local_98 = issuer_certificate;
    local_90 = verify_time_epoch_seconds;
    local_88 = cert;
    local_80 = puVar8;
    do {
      local_78 = (uchar *)0x0;
      sStack_70 = 0;
      local_40 = (uchar *)0x0;
      sStack_38 = 0;
      raw_tlv_00.data_.size_ = (size_t)&local_78;
      raw_tlv_00.data_.data_ = (uchar *)puVar10[1];
      bVar5 = ParseOCSPSingleResponse((bssl *)*puVar10,raw_tlv_00,(OCSPSingleResponse *)out);
      iVar7 = 1;
      if (bVar5) {
        if (local_42 == '\x01') {
          extensions_tlv.data_.size_ = sStack_38;
          extensions_tlv.data_.data_ = local_40;
          local_d0._8_4_ = _S_red;
          p_Stack_c0 = (_Base_ptr)0x0;
          local_a8 = (uchar *)0x0;
          local_b8 = p_Var2;
          p_Stack_b0 = p_Var2;
          bVar5 = ParseExtensions(extensions_tlv,
                                  (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                   *)local_d0);
          if (bVar5) {
            local_e8 = (ParsedCertificate *)0x279d6010401062b;
            uStack_e0 = 0x504;
            for (p_Var6 = local_b8; p_Var6 != p_Var2;
                p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
              lhs.data_.data_ = (uchar *)p_Var6[1]._M_left;
              lhs.data_.size_ = (size_t)p_Var6[1]._M_right;
              rhs.data_.size_ = 10;
              rhs.data_.data_ = (uchar *)&local_e8;
              bVar5 = bssl::der::operator==(lhs,rhs);
              out = (uint *)0x3;
              if ((!bVar5) && (out = (uint *)0x0, *(char *)&p_Var6[2]._M_left == '\x01')) {
                *(undefined4 *)
                 max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload = 9;
                out = (uint *)0x1;
              }
              if (((int)out != 3) && ((int)out != 0)) break;
            }
            ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                         *)local_d0);
            puVar8 = local_80;
            if (p_Var6 == p_Var2) goto LAB_004b0db8;
          }
          else {
            *(undefined4 *)
             max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload = 8;
            ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                         *)local_d0);
          }
        }
        else {
LAB_004b0db8:
          local_a8 = (uchar *)0x0;
          sStack_a0 = 0;
          local_b8 = (_Rb_tree_node_base *)0x0;
          p_Stack_b0 = (_Rb_tree_node_base *)0x0;
          local_d0._8_4_ = _S_red;
          uStack_c4 = 0;
          p_Stack_c0 = (_Base_ptr)0x0;
          raw_tlv.data_.size_ = sStack_70;
          raw_tlv.data_.data_ = local_78;
          bVar5 = ParseOCSPCertID(raw_tlv,(OCSPCertID *)local_d0);
          iVar7 = 1;
          if (bVar5) {
            iVar7 = 3;
            out = &switchD_004b0e0d::switchdataD_005a6ed8;
            switch(local_d0._0_4_) {
            case 0:
            case 1:
            case 2:
              goto switchD_004b0e0d_caseD_0;
            case 3:
              type = EVP_sha1();
              break;
            case 4:
              type = EVP_sha256();
              break;
            case 5:
              type = EVP_sha384();
              break;
            case 6:
              type = EVP_sha512();
              break;
            default:
              type = (EVP_MD *)0x0;
            }
            hash.data_.data_._4_4_ = uStack_c4;
            hash.data_.data_._0_4_ = local_d0._8_4_;
            hash.data_.size_ = (size_t)p_Stack_c0;
            pIVar1 = &local_d8[1].responder_id.name;
            out = (uint *)(pIVar1->data_).data_;
            bVar5 = VerifyHash((EVP_MD *)type,hash,(Input)pIVar1->data_);
            if (bVar5) {
              local_e8 = (ParsedCertificate *)0x0;
              uStack_e0 = 0;
              uStack_de = 0;
              spki_tlv.data_.size_ = (size_t)&local_e8;
              spki_tlv.data_.data_ = (uchar *)(local_88->tbs_).spki_tlv.data_.size_;
              bVar5 = GetSubjectPublicKeyBytes
                                ((anon_unknown_20 *)(local_88->tbs_).spki_tlv.data_.data_,spki_tlv,
                                 (Input *)out);
              if ((bVar5) &&
                 (hash_00.data_.size_ = (size_t)p_Stack_b0, hash_00.data_.data_ = (uchar *)local_b8,
                 value.data_.size_._0_2_ = uStack_e0, value.data_.data_ = (uchar *)local_e8,
                 value.data_.size_._2_6_ = uStack_de, out = (uint *)local_e8,
                 bVar5 = VerifyHash((EVP_MD *)type,hash_00,value), bVar5)) {
                lhs_00.data_.size_ = sStack_a0;
                lhs_00.data_.data_ = local_a8;
                out = (uint *)(local_d8->extensions).data_.size_;
                bVar5 = bssl::der::operator==(lhs_00,(Input)(local_d8->extensions).data_);
                if (bVar5) {
                  this_update = (GeneralizedTime *)0x0;
                  if (local_4c != '\0') {
                    this_update = &local_4a;
                  }
                  max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload._M_value =
                       (ulong)response_details & 0xff;
                  max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._8_8_ = pRVar9;
                  bVar5 = CheckRevocationDateValid
                                    (local_54,this_update,(GeneralizedTime *)local_98,local_90,
                                     max_age_seconds_00);
                  uVar3 = *(uint *)max_age_seconds.super__Optional_base<long,_true,_true>._M_payload
                                   .super__Optional_payload_base<long>._M_payload;
                  out = (uint *)(ulong)uVar3;
                  if (bVar5) {
                    OVar4 = local_f0;
                    if (local_68 == REVOKED) {
                      OVar4 = local_68;
                    }
                    if (local_f0 == GOOD) {
                      OVar4 = local_68;
                    }
                    local_f0 = OVar4;
                    if (uVar3 != 2) {
                      local_f0 = local_68;
                    }
                    *(undefined4 *)
                     max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload = 2;
                    iVar7 = 0;
                  }
                  else if (uVar3 != 2) {
                    *(undefined4 *)
                     max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload = 6;
                  }
                }
              }
            }
          }
        }
      }
switchD_004b0e0d_caseD_0:
      if ((iVar7 != 3) && (iVar7 != 0)) goto LAB_004b0f6c;
      puVar10 = puVar10 + 2;
    } while (puVar10 != puVar8);
  }
  return local_f0;
}

Assistant:

OCSPRevocationStatus GetRevocationStatusForCert(
    const OCSPResponseData &response_data, const ParsedCertificate *cert,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  OCSPRevocationStatus result = OCSPRevocationStatus::UNKNOWN;
  *response_details = OCSPVerifyResult::NO_MATCHING_RESPONSE;

  for (const auto &single_response_der : response_data.responses) {
    // In the common case, there should only be one SingleResponse in the
    // ResponseData (matching the certificate requested and used on this
    // connection). However, it is possible for the OCSP responder to provide
    // multiple responses for multiple certificates. Look through all the
    // provided SingleResponses, and check to see if any match the
    // certificate. A SingleResponse matches a certificate if it has the same
    // serial number, issuer name (hash), and issuer public key (hash).
    OCSPSingleResponse single_response;
    if (!ParseOCSPSingleResponse(single_response_der, &single_response)) {
      return OCSPRevocationStatus::UNKNOWN;
    }

    // Reject unhandled critical extensions in SingleResponse
    if (single_response.has_extensions &&
        !ParseOCSPSingleResponseExtensions(single_response.extensions,
                                           response_details)) {
      return OCSPRevocationStatus::UNKNOWN;
    }

    OCSPCertID cert_id;
    if (!ParseOCSPCertID(single_response.cert_id_tlv, &cert_id)) {
      return OCSPRevocationStatus::UNKNOWN;
    }
    if (!CheckCertIDMatchesCertificate(cert_id, cert, issuer_certificate)) {
      continue;
    }

    // The SingleResponse matches the certificate, but may be out of date. Out
    // of date responses are noted seperate from responses with mismatched
    // serial numbers. If an OCSP responder provides both an up to date
    // response and an expired response, the up to date response takes
    // precedence (PROVIDED > INVALID_DATE).
    if (!CheckRevocationDateValid(single_response.this_update,
                                  single_response.has_next_update
                                      ? &single_response.next_update
                                      : nullptr,
                                  verify_time_epoch_seconds, max_age_seconds)) {
      if (*response_details != OCSPVerifyResult::PROVIDED) {
        *response_details = OCSPVerifyResult::INVALID_DATE;
      }
      continue;
    }

    // In the case with multiple matching and up to date responses, keep only
    // the strictest status (REVOKED > UNKNOWN > GOOD).
    if (*response_details != OCSPVerifyResult::PROVIDED ||
        result == OCSPRevocationStatus::GOOD ||
        single_response.cert_status.status == OCSPRevocationStatus::REVOKED) {
      result = single_response.cert_status.status;
    }
    *response_details = OCSPVerifyResult::PROVIDED;
  }

  return result;
}